

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

ostream * __thiscall
lf::refinement::MeshHierarchy::PrintInfo(MeshHierarchy *this,ostream *o,uint ctrl)

{
  undefined8 uVar1;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> this_00;
  RefEl RVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  pointer psVar7;
  undefined1 local_38 [24];
  Mesh *mesh;
  uint level;
  uint ctrl_local;
  ostream *o_local;
  MeshHierarchy *this_local;
  
  mesh._4_4_ = ctrl;
  _level = (MeshFactory *)o;
  o_local = (ostream *)this;
  poVar6 = std::operator<<(o,"MeshHierarchy, ");
  sVar3 = NumLevels(this);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar3);
  poVar6 = std::operator<<(poVar6," levels: ");
  std::operator<<(poVar6,'\n');
  mesh._0_4_ = 0;
  while( true ) {
    uVar5 = (uint)mesh;
    sVar3 = NumLevels(this);
    if (sVar3 <= uVar5) break;
    getMesh((MeshHierarchy *)local_38,(size_type)this);
    psVar7 = (pointer)std::
                      __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_38);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_38)
    ;
    local_38._16_8_ = psVar7;
    poVar6 = std::operator<<((ostream *)_level,"l=");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)mesh);
    std::operator<<(poVar6,": ");
    this_00._M_t.
    super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
    super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
         (__uniq_ptr_data<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>,_true,_true>
          )(__uniq_ptr_data<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>,_true,_true>
            )_level;
    if (mesh._4_4_ == 0) {
      iVar4 = (*(code *)((__shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_38._16_8_
                        )->_M_ptr->_vptr_Mesh)();
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((void *)this_00._M_t.
                                  super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>.
                                  _M_head_impl,iVar4);
      poVar6 = std::operator<<(poVar6,"D -> ");
      iVar4 = (*(code *)((__shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_38._16_8_
                        )->_M_ptr[1]._vptr_Mesh)();
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,"D, ");
      uVar5 = (*(code *)((__shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_38._16_8_
                        )->_M_ptr[3]._vptr_Mesh)(local_38._16_8_,0);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
      poVar6 = std::operator<<(poVar6," cells [");
      uVar1 = local_38._16_8_;
      RVar2 = lf::base::RefEl::kTria();
      uVar5 = (*(code *)((__shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2> *)uVar1)->_M_ptr
                        [4]._vptr_Mesh)(uVar1,(ulong)RVar2.type_);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
      poVar6 = std::operator<<(poVar6," tria, ");
      uVar1 = local_38._16_8_;
      RVar2 = lf::base::RefEl::kQuad();
      uVar5 = (*(code *)((__shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2> *)uVar1)->_M_ptr
                        [4]._vptr_Mesh)(uVar1,(ulong)RVar2.type_);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
      poVar6 = std::operator<<(poVar6," quad], ");
      uVar5 = (*(code *)((__shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_38._16_8_
                        )->_M_ptr[3]._vptr_Mesh)(local_38._16_8_,1);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
      poVar6 = std::operator<<(poVar6," edges, ");
      uVar5 = (*(code *)((__shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_38._16_8_
                        )->_M_ptr[3]._vptr_Mesh)(local_38._16_8_,2);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
      poVar6 = std::operator<<(poVar6," nodes");
      std::operator<<(poVar6,'\n');
    }
    else {
      lf::mesh::utils::PrintInfo((ostream *)_level,(Mesh *)local_38._16_8_,0xb);
    }
    mesh._0_4_ = (uint)mesh + 1;
  }
  return (ostream *)
         (__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)_level
  ;
}

Assistant:

std::ostream &MeshHierarchy::PrintInfo(std::ostream &o, unsigned ctrl) const {
  o << "MeshHierarchy, " << NumLevels() << " levels: " << '\n';
  for (unsigned level = 0; level < NumLevels(); ++level) {
    const lf::mesh::Mesh &mesh{*getMesh(level)};
    o << "l=" << level << ": ";
    if (ctrl != 0) {
      lf::mesh::utils::PrintInfo(o, mesh);
    } else {
      o << static_cast<int>(mesh.DimMesh()) << "D -> "
        << static_cast<int>(mesh.DimWorld()) << "D, " << mesh.NumEntities(0)
        << " cells [" << mesh.NumEntities(lf::base::RefEl::kTria()) << " tria, "
        << mesh.NumEntities(lf::base::RefEl::kQuad()) << " quad], "
        << mesh.NumEntities(1) << " edges, " << mesh.NumEntities(2) << " nodes"
        << '\n';
    }
  }
  return o;
}